

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O1

void __thiscall mailManager::~mailManager(mailManager *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  mailSocket::sendData(this->socket,"quit\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  p_Var2 = (this->list).super__List_base<FILEINFO_*,_std::allocator<FILEINFO_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->list) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->map)._M_t);
  return;
}

Assistant:

mailManager::~mailManager() {
    socket->sendData("quit\r\n");
    socket->recvData(recvData, BUF_SIZE);
}